

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

void __thiscall gnuplotio::GnuplotTmpfile::~GnuplotTmpfile(GnuplotTmpfile *this)

{
  pointer pcVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->debug_messages == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"delete tmpfile ",0xf);
    pcVar1 = (this->file).m_pathname._M_dataplus._M_p;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->file).m_pathname._M_string_length);
    pbVar2 = boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_38,'&',
                        '\"');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    std::ios::widen((char)pbVar2->_vptr_basic_ostream[-3] + (char)pbVar2);
    std::ostream::put((char)pbVar2);
    std::ostream::flush();
  }
  boost::filesystem::detail::remove(&this->file,(error_code *)0x0);
  pcVar1 = (this->file).m_pathname._M_dataplus._M_p;
  paVar3 = &(this->file).m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~GnuplotTmpfile() {
        if(debug_messages) {
            std::cerr << "delete tmpfile " << file << std::endl;
        }
        // it is never good to throw exceptions from a destructor
        try {
            remove(file);
        } catch(const std::exception &) {
            std::cerr << "Failed to remove temporary file " << file << std::endl;
        }
    }